

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  iVar2 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar2 == 0) {
    *(uint16_t *)(buf->base + buf->off) = group << 8 | group >> 8;
    buf->off = buf->off + 2;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = ptls_buffer_reserve_aligned(buf,2,'\0');
    if (iVar2 == 0) {
      puVar1 = buf->base;
      sVar5 = buf->off;
      (puVar1 + sVar5)[0] = '\0';
      (puVar1 + sVar5)[1] = '\0';
      buf->off = buf->off + 2;
      iVar2 = 0;
    }
    if (iVar2 == 0) {
      sVar5 = buf->off;
      iVar2 = ptls_buffer__do_pushv(buf,pubkey.base,pubkey.len);
      if (iVar2 == 0) {
        uVar4 = buf->off - sVar5;
        iVar2 = 0x20c;
        if (uVar4 < 0x10000) {
          lVar3 = 8;
          do {
            buf->base[sVar5 - 2] = (uint8_t)(uVar4 >> ((byte)lVar3 & 0x3f));
            lVar3 = lVar3 + -8;
            sVar5 = sVar5 + 1;
            iVar2 = 0;
          } while (lVar3 != -8);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}